

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>::iterator,_bool>
* __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<upb_MiniTable_const*>,absl::lts_20240722::container_internal::HashEq<upb_MiniTable_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<upb_MiniTable_const*,void>::Eq,std::allocator<upb_MiniTable_const*>>
::find_or_prepare_insert_soo<upb_MiniTable_const*>
          (pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<upb_MiniTable_const*>,absl::lts_20240722::container_internal::HashEq<upb_MiniTable_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<upb_MiniTable_const*,void>::Eq,std::allocator<upb_MiniTable_const*>>
          *this,upb_MiniTable **key)

{
  slot_type *ppuVar1;
  size_t sVar2;
  bool bVar3;
  iterator iVar4;
  
  if (*(ulong *)(this + 8) < 2) {
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
    ::try_sample_soo((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                      *)this);
    CommonFields::set_full_soo((CommonFields *)this);
    iVar4 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
            ::soo_iterator((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                            *)this);
  }
  else {
    ppuVar1 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
              ::soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                          *)this);
    if (*ppuVar1 == *key) {
      iVar4 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
              ::soo_iterator((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                              *)this);
      bVar3 = false;
      goto LAB_001115c2;
    }
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
    ::resize_impl(this,3);
    sVar2 = HashEq<upb_MiniTable_const*,void>::Hash::operator()((Hash *)this,key);
    sVar2 = absl::lts_20240722::container_internal::PrepareInsertAfterSoo
                      (sVar2,8,(CommonFields *)this);
    iVar4 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
            ::iterator_at((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                           *)this,sVar2);
  }
  bVar3 = true;
LAB_001115c2:
  __return_storage_ptr__->first = iVar4;
  __return_storage_ptr__->second = bVar3;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_soo(const K& key) {
    if (empty()) {
      const HashtablezInfoHandle infoz = try_sample_soo();
      if (infoz.IsSampled()) {
        resize_with_soo_infoz(infoz);
      } else {
        common().set_full_soo();
        return {soo_iterator(), true};
      }
    } else if (PolicyTraits::apply(EqualElement<K>{key, eq_ref()},
                                   PolicyTraits::element(soo_slot()))) {
      return {soo_iterator(), false};
    } else {
      resize(NextCapacity(SooCapacity()));
    }
    const size_t index =
        PrepareInsertAfterSoo(hash_ref()(key), sizeof(slot_type), common());
    return {iterator_at(index), true};
  }